

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

void * crnd::crnd_get_level_data(void *pData,uint32 data_size,uint32 level_index,uint32 *pSize)

{
  uint uVar1;
  crn_header *pcVar2;
  
  if (pSize != (uint32 *)0x0) {
    *pSize = 0;
  }
  if (((0x3d < data_size && pData != (void *)0x0) &&
      (pcVar2 = crnd_get_header(pData,data_size), pcVar2 != (crn_header *)0x0)) &&
     (level_index < (pcVar2->m_levels).m_buf[0])) {
    uVar1 = crn_packed_uint::operator_cast_to_unsigned_int(pcVar2->m_level_ofs + level_index);
    if (pSize != (uint32 *)0x0) {
      if (level_index + 1 < (uint)(pcVar2->m_levels).m_buf[0]) {
        data_size = crn_packed_uint::operator_cast_to_unsigned_int
                              (pcVar2->m_level_ofs + (level_index + 1));
      }
      *pSize = data_size - uVar1;
    }
    return (void *)((long)pData + (ulong)uVar1);
  }
  return (void *)0x0;
}

Assistant:

const void* crnd_get_level_data(const void* pData, uint32 data_size, uint32 level_index, uint32* pSize)
    {
        if (pSize)
            *pSize = 0;

        if ((!pData) || (data_size < cCRNHeaderMinSize))
            return NULL;

        const crn_header* pHeader = crnd_get_header(pData, data_size);
        if (!pHeader)
            return NULL;

        if (level_index >= pHeader->m_levels)
            return NULL;

        uint32 cur_level_ofs = pHeader->m_level_ofs[level_index];

        if (pSize)
        {
            uint32 next_level_ofs = data_size;
            if ((level_index + 1) < (pHeader->m_levels))
                next_level_ofs = pHeader->m_level_ofs[level_index + 1];

            *pSize = next_level_ofs - cur_level_ofs;
        }

        return static_cast<const uint8*>(pData) + cur_level_ofs;
    }